

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_187f8::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  size_t i;
  long lVar12;
  double dVar13;
  Edit local_40;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"             sample counts ");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_40._channel = (SampleCountChannel *)(level + 0x58);
  iVar2 = *(int *)(level + 0x78);
  iVar11 = *(int *)(level + 0x74);
  local_40._sampleCounts = (uint *)Imf_3_4::SampleCountChannel::beginEdit();
  for (lVar12 = 0; iVar2 * iVar11 != lVar12; lVar12 = lVar12 + 1) {
    lVar4 = Imath_3_2::nrand48(random->_state);
    local_40._sampleCounts[lVar12] = (uint)(lVar4 % 10);
  }
  Imf_3_4::SampleCountChannel::Edit::~Edit(&local_40);
  p_Var5 = (_Rb_tree_node_base *)Imf_3_4::DeepImageLevel::begin();
  do {
    p_Var6 = (_Rb_tree_node_base *)Imf_3_4::DeepImageLevel::end();
    if (p_Var5 == p_Var6) {
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"             channel ");
    poVar3 = std::operator<<(poVar3,(string *)(p_Var5 + 1));
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = (**(code **)**(undefined8 **)(p_Var5 + 2))();
    if (iVar2 == 0) {
      lVar12 = __dynamic_cast(*(undefined8 *)(p_Var5 + 2),&Imf_3_4::DeepImageChannel::typeinfo,
                              &Imf_3_4::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
      if (lVar12 == 0) goto LAB_0010c016;
      lVar4 = *(long *)(lVar12 + 8);
      lVar7 = Imf_3_4::DeepImageChannel::deepLevel();
      for (iVar2 = *(int *)(lVar4 + 0x1c); iVar2 <= *(int *)(lVar4 + 0x24); iVar2 = iVar2 + 1) {
        for (iVar11 = *(int *)(lVar4 + 0x18); iVar11 <= *(int *)(lVar4 + 0x20); iVar11 = iVar11 + 1)
        {
          puVar8 = Imf_3_4::SampleCountChannel::at
                             ((SampleCountChannel *)(lVar7 + 0x58),iVar11,iVar2);
          uVar1 = *puVar8;
          lVar9 = Imf_3_4::TypedDeepImageChannel<unsigned_int>::at((int)lVar12,iVar11);
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
            dVar13 = Imath_3_2::Rand48::nextf(random,0.0,100.0);
            *(int *)(lVar9 + uVar10 * 4) = (int)(long)dVar13;
          }
        }
      }
    }
    else if (iVar2 == 2) {
      lVar12 = __dynamic_cast(*(undefined8 *)(p_Var5 + 2),&Imf_3_4::DeepImageChannel::typeinfo,
                              &Imf_3_4::TypedDeepImageChannel<float>::typeinfo,0);
      if (lVar12 == 0) goto LAB_0010c016;
      lVar4 = *(long *)(lVar12 + 8);
      lVar7 = Imf_3_4::DeepImageChannel::deepLevel();
      for (iVar2 = *(int *)(lVar4 + 0x1c); iVar2 <= *(int *)(lVar4 + 0x24); iVar2 = iVar2 + 1) {
        for (iVar11 = *(int *)(lVar4 + 0x18); iVar11 <= *(int *)(lVar4 + 0x20); iVar11 = iVar11 + 1)
        {
          puVar8 = Imf_3_4::SampleCountChannel::at
                             ((SampleCountChannel *)(lVar7 + 0x58),iVar11,iVar2);
          uVar1 = *puVar8;
          lVar9 = Imf_3_4::TypedDeepImageChannel<float>::at((int)lVar12,iVar11);
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
            dVar13 = Imath_3_2::Rand48::nextf(random,0.0,100.0);
            *(float *)(lVar9 + uVar10 * 4) = (float)dVar13;
          }
        }
      }
    }
    else {
      if (iVar2 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0xed,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)");
      }
      lVar12 = __dynamic_cast(*(undefined8 *)(p_Var5 + 2),&Imf_3_4::DeepImageChannel::typeinfo,
                              &Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
      if (lVar12 == 0) {
LAB_0010c016:
        __cxa_bad_cast();
      }
      lVar4 = *(long *)(lVar12 + 8);
      lVar7 = Imf_3_4::DeepImageChannel::deepLevel();
      for (iVar2 = *(int *)(lVar4 + 0x1c); iVar2 <= *(int *)(lVar4 + 0x24); iVar2 = iVar2 + 1) {
        for (iVar11 = *(int *)(lVar4 + 0x18); iVar11 <= *(int *)(lVar4 + 0x20); iVar11 = iVar11 + 1)
        {
          puVar8 = Imf_3_4::SampleCountChannel::at
                             ((SampleCountChannel *)(lVar7 + 0x58),iVar11,iVar2);
          uVar1 = *puVar8;
          lVar9 = Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::at((int)lVar12,iVar11);
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
            dVar13 = Imath_3_2::Rand48::nextf(random,0.0,100.0);
            Imath_3_2::half::half((half *)&local_40,(float)dVar13);
            *(undefined2 *)(lVar9 + uVar10 * 2) = local_40._channel._0_2_;
          }
        }
      }
    }
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void
fillChannels (Rand48& random, DeepImageLevel& level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts ());

    for (DeepImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}